

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-wrap.cpp
# Opt level: O0

void __thiscall CommandOptions::CommandOptions(CommandOptions *this,int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  ChannelFormat_t CVar5;
  long lVar6;
  byte_t *value;
  ulong uVar7;
  size_type sVar8;
  reference pvVar9;
  allocator<char> local_d9;
  string local_d8 [39];
  allocator<char> local_b1;
  value_type local_b0;
  allocator<char> local_89;
  string local_88;
  uint local_64;
  uint local_60;
  ui32_t length_2;
  ui32_t length_1;
  ui32_t length;
  string local_50 [4];
  int i;
  string mca_config_str;
  char **argv_local;
  int argc_local;
  CommandOptions *this_local;
  
  this->error_flag = true;
  this->key_flag = false;
  this->asset_id_flag = false;
  this->encrypt_header_flag = true;
  this->write_hmac = true;
  this->verbose_flag = false;
  this->fb_dump_size = 0;
  this->no_write_flag = false;
  this->version_flag = false;
  this->help_flag = false;
  this->stereo_image_flag = false;
  this->write_partial_pcm_flag = false;
  this->start_frame = 0;
  this->duration = 0xffffffff;
  this->use_smpte_labels = false;
  this->j2c_pedantic = true;
  this->fb_size = 0x400000;
  this->key_id_flag = false;
  this->channel_fmt = CF_NONE;
  std::__cxx11::string::string((string *)&this->out_file);
  this->show_ul_values_flag = false;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list(&this->filenames);
  ASDCP::UL::UL(&this->channel_assignment);
  ASDCP::UL::UL(&this->picture_coding);
  ASDCP::UL::UL(&this->transfer_characteristic);
  ASDCP::UL::UL(&this->aux_data_coding);
  this->dolby_atmos_sync_flag = false;
  this->ffoa = 0;
  this->max_channel_count = 10;
  this->max_object_count = 0x76;
  this->use_interop_sound_wtf = false;
  ASDCP::MXF::ASDCP_MCAConfigParser::ASDCP_MCAConfigParser(&this->mca_config,g_dict);
  std::__cxx11::string::string((string *)&this->mca_language);
  memset(this->key_value,0,0x10);
  memset(this->key_id_value,0,0x10);
  std::__cxx11::string::string(local_50);
  for (length = 1; (int)length < argc; length = length + 1) {
    iVar4 = strcmp(argv[(int)length],"-help");
    if (iVar4 == 0) {
      this->help_flag = true;
    }
    else if ((*argv[(int)length] == '-') &&
            (((iVar4 = isalpha((int)argv[(int)length][1]), iVar4 != 0 ||
              (iVar4 = isdigit((int)argv[(int)length][1]), iVar4 != 0)) &&
             (argv[(int)length][2] == '\0')))) {
      switch(argv[(int)length][1]) {
      case '3':
        this->stereo_image_flag = true;
        break;
      default:
        fprintf(_stderr,"Unrecognized option: %s\n",argv[(int)length]);
        length_1 = 1;
        goto LAB_00119955;
      case 'A':
        length = length + 1;
        if ((argc <= (int)length) || (*argv[(int)length] == '-')) {
          fprintf(_stderr,"Argument not found for option -%c.\n",0x41);
          length_1 = 1;
          goto LAB_00119955;
        }
        bVar2 = Kumu::Identifier<16U>::DecodeHex
                          (&(this->aux_data_coding).super_Identifier<16U>,argv[(int)length]);
        if (!bVar2) {
          fprintf(_stderr,"Error decoding UL value: %s\n",argv[(int)length]);
          length_1 = 1;
          goto LAB_00119955;
        }
        break;
      case 'C':
        length = length + 1;
        if ((argc <= (int)length) || (*argv[(int)length] == '-')) {
          fprintf(_stderr,"Argument not found for option -%c.\n",0x43);
          length_1 = 1;
          goto LAB_00119955;
        }
        bVar2 = Kumu::Identifier<16U>::DecodeHex
                          (&(this->channel_assignment).super_Identifier<16U>,argv[(int)length]);
        if (!bVar2) {
          fprintf(_stderr,"Error decoding UL value: %s\n",argv[(int)length]);
          length_1 = 1;
          goto LAB_00119955;
        }
        break;
      case 'E':
        this->encrypt_header_flag = false;
        break;
      case 'L':
        this->use_smpte_labels = true;
        break;
      case 'M':
        this->write_hmac = false;
        break;
      case 'P':
        length = length + 1;
        if ((argc <= (int)length) || (*argv[(int)length] == '-')) {
          fprintf(_stderr,"Argument not found for option -%c.\n",0x50);
          length_1 = 1;
          goto LAB_00119955;
        }
        bVar2 = Kumu::Identifier<16U>::DecodeHex
                          (&(this->picture_coding).super_Identifier<16U>,argv[(int)length]);
        if (!bVar2) {
          fprintf(_stderr,"Error decoding UL value: %s\n",argv[(int)length]);
          length_1 = 1;
          goto LAB_00119955;
        }
        break;
      case 'Q':
        value = ASDCP::Dictionary::ul(g_dict,MDD_TransferCharacteristic_SMPTEST2084);
        Kumu::Identifier<16U>::Set(&(this->transfer_characteristic).super_Identifier<16U>,value);
        break;
      case 'T':
        length = length + 1;
        if ((argc <= (int)length) || (*argv[(int)length] == '-')) {
          fprintf(_stderr,"Argument not found for option -%c.\n",0x54);
          length_1 = 1;
          goto LAB_00119955;
        }
        bVar2 = Kumu::Identifier<16U>::DecodeHex
                          (&(this->transfer_characteristic).super_Identifier<16U>,argv[(int)length])
        ;
        if (!bVar2) {
          fprintf(_stderr,"Error decoding UL value: %s\n",argv[(int)length]);
          length_1 = 1;
          goto LAB_00119955;
        }
        break;
      case 'V':
        this->version_flag = true;
        break;
      case 'W':
        this->no_write_flag = true;
        break;
      case 'Z':
        this->j2c_pedantic = false;
        break;
      case 'a':
        this->asset_id_flag = true;
        length = length + 1;
        if ((argc <= (int)length) || (*argv[(int)length] == '-')) {
          fprintf(_stderr,"Argument not found for option -%c.\n",0x61);
          length_1 = 1;
          goto LAB_00119955;
        }
        Kumu::hex2bin(argv[(int)length],this->asset_id_value,0x10,&length_2);
        if (length_2 != 0x10) {
          fprintf(_stderr,"Unexpected asset ID length: %u, expecting %u characters.\n",
                  (ulong)length_2,0x10);
          length_1 = 1;
          goto LAB_00119955;
        }
        break;
      case 'b':
        length = length + 1;
        if ((argc <= (int)length) || (*argv[(int)length] == '-')) {
          fprintf(_stderr,"Argument not found for option -%c.\n",0x62);
          length_1 = 1;
          goto LAB_00119955;
        }
        lVar6 = strtol(argv[(int)length],(char **)0x0,10);
        lVar6 = Kumu::xabs<long>(lVar6);
        this->fb_size = (ui32_t)lVar6;
        if ((this->verbose_flag & 1U) != 0) {
          fprintf(_stderr,"Frame Buffer size: %u bytes.\n",(ulong)this->fb_size);
        }
        break;
      case 'd':
        length = length + 1;
        if ((argc <= (int)length) || (*argv[(int)length] == '-')) {
          fprintf(_stderr,"Argument not found for option -%c.\n",100);
          length_1 = 1;
          goto LAB_00119955;
        }
        lVar6 = strtol(argv[(int)length],(char **)0x0,10);
        lVar6 = Kumu::xabs<long>(lVar6);
        this->duration = (ui32_t)lVar6;
        break;
      case 'e':
        this->encrypt_header_flag = true;
        break;
      case 'f':
        length = length + 1;
        if ((argc <= (int)length) || (*argv[(int)length] == '-')) {
          fprintf(_stderr,"Argument not found for option -%c.\n",0x66);
          length_1 = 1;
          goto LAB_00119955;
        }
        lVar6 = strtol(argv[(int)length],(char **)0x0,10);
        lVar6 = Kumu::xabs<long>(lVar6);
        this->start_frame = (ui32_t)lVar6;
        break;
      case 'g':
        length = length + 1;
        if ((argc <= (int)length) || (*argv[(int)length] == '-')) {
          fprintf(_stderr,"Argument not found for option -%c.\n",0x67);
          length_1 = 1;
          goto LAB_00119955;
        }
        std::__cxx11::string::operator=((string *)&this->mca_language,argv[(int)length]);
        break;
      case 'h':
        this->help_flag = true;
        break;
      case 'j':
        this->key_id_flag = true;
        length = length + 1;
        if ((argc <= (int)length) || (*argv[(int)length] == '-')) {
          fprintf(_stderr,"Argument not found for option -%c.\n",0x6a);
          length_1 = 1;
          goto LAB_00119955;
        }
        Kumu::hex2bin(argv[(int)length],this->key_id_value,0x10,&local_60);
        if (local_60 != 0x10) {
          fprintf(_stderr,"Unexpected key ID length: %u, expecting %u characters.\n",(ulong)local_60
                  ,0x10);
          length_1 = 1;
          goto LAB_00119955;
        }
        break;
      case 'k':
        this->key_flag = true;
        length = length + 1;
        if ((argc <= (int)length) || (*argv[(int)length] == '-')) {
          fprintf(_stderr,"Argument not found for option -%c.\n",0x6b);
          length_1 = 1;
          goto LAB_00119955;
        }
        Kumu::hex2bin(argv[(int)length],this->key_value,0x10,&local_64);
        if (local_64 != 0x10) {
          fprintf(_stderr,"Unexpected key length: %u, expecting %u characters.\n",(ulong)local_64,
                  0x10);
          length_1 = 1;
          goto LAB_00119955;
        }
        break;
      case 'l':
        length = length + 1;
        if ((argc <= (int)length) || (*argv[(int)length] == '-')) {
          fprintf(_stderr,"Argument not found for option -%c.\n",0x6c);
          length_1 = 1;
          goto LAB_00119955;
        }
        pcVar1 = argv[(int)length];
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,pcVar1,&local_89);
        CVar5 = decode_channel_fmt(&local_88);
        this->channel_fmt = CVar5;
        std::__cxx11::string::~string((string *)&local_88);
        std::allocator<char>::~allocator(&local_89);
        break;
      case 'm':
        length = length + 1;
        if (argc <= (int)length) {
          fprintf(_stderr,"Argument not found for option -%c.\n",0x6d);
          length_1 = 1;
          goto LAB_00119955;
        }
        std::__cxx11::string::operator=(local_50,argv[(int)length]);
        break;
      case 'p':
        length = length + 1;
        if ((argc <= (int)length) || (*argv[(int)length] == '-')) {
          fprintf(_stderr,"Argument not found for option -%c.\n",0x70);
          length_1 = 1;
          goto LAB_00119955;
        }
        lVar6 = strtol(argv[(int)length],(char **)0x0,10);
        lVar6 = Kumu::xabs<long>(lVar6);
        this->picture_rate = (ui32_t)lVar6;
        break;
      case 's':
        this->dolby_atmos_sync_flag = true;
        break;
      case 'u':
        this->show_ul_values_flag = true;
        break;
      case 'v':
        this->verbose_flag = true;
        break;
      case 'w':
        this->use_interop_sound_wtf = true;
        break;
      case 'x':
        this->write_partial_pcm_flag = true;
        break;
      case 'z':
        this->j2c_pedantic = true;
      }
    }
    else {
      if (*argv[(int)length] == '-') {
        fprintf(_stderr,"Unrecognized argument: %s\n",argv[(int)length]);
        length_1 = 1;
        goto LAB_00119955;
      }
      pcVar1 = argv[(int)length];
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,pcVar1,&local_b1);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->filenames,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator(&local_b1);
    }
  }
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      bVar3 = ASDCP::MXF::ASDCP_MCAConfigParser::DecodeString((string *)&this->mca_config,local_50);
      if ((bVar3 & 1) == 0) {
        length_1 = 1;
        goto LAB_00119955;
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_d8,"en-US",&local_d9);
      bVar3 = ASDCP::MXF::ASDCP_MCAConfigParser::DecodeString((string *)&this->mca_config,local_50);
      std::__cxx11::string::~string(local_d8);
      std::allocator<char>::~allocator(&local_d9);
      if (((bVar3 ^ 0xff) & 1) != 0) {
        length_1 = 1;
        goto LAB_00119955;
      }
    }
  }
  if (((this->help_flag & 1U) == 0) && ((this->version_flag & 1U) == 0)) {
    sVar8 = std::__cxx11::
            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->filenames);
    if (sVar8 < 2) {
      fputs("Option requires at least two filename arguments: <input-file> <output-file>\n",_stderr)
      ;
      length_1 = 1;
    }
    else {
      pvVar9 = std::__cxx11::
               list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::back(&this->filenames);
      std::__cxx11::string::operator=((string *)&this->out_file,(string *)pvVar9);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back(&this->filenames);
      this->error_flag = false;
      length_1 = 0;
    }
  }
  else {
    length_1 = 1;
  }
LAB_00119955:
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

CommandOptions(int argc, const char** argv) :
    error_flag(true), key_flag(false), key_id_flag(false), asset_id_flag(false),
    encrypt_header_flag(true), write_hmac(true),
    verbose_flag(false), fb_dump_size(0),
    no_write_flag(false), version_flag(false), help_flag(false), stereo_image_flag(false),
    write_partial_pcm_flag(false), start_frame(0),
    duration(0xffffffff), use_smpte_labels(false), j2c_pedantic(true),
    fb_size(FRAME_BUFFER_SIZE),
    channel_fmt(PCM::CF_NONE),
    ffoa(0), max_channel_count(10), max_object_count(118), // hard-coded sample atmos properties
    dolby_atmos_sync_flag(false),
    show_ul_values_flag(false),
    mca_config(g_dict),
    use_interop_sound_wtf(false)
  {
    memset(key_value, 0, KeyLen);
    memset(key_id_value, 0, UUIDlen);
    std::string mca_config_str;

    for ( int i = 1; i < argc; i++ )
      {

	if ( (strcmp( argv[i], "-help") == 0) )
	  {
	    help_flag = true;
	    continue;
	  }

	if ( argv[i][0] == '-'
	     && ( isalpha(argv[i][1]) || isdigit(argv[i][1]) )
	     && argv[i][2] == 0 )
	  {
	    switch ( argv[i][1] )
	      {
	      case '3': stereo_image_flag = true; break;

	      case 'A':
		TEST_EXTRA_ARG(i, 'A');
		if ( ! aux_data_coding.DecodeHex(argv[i]) )
		  {
		    fprintf(stderr, "Error decoding UL value: %s\n", argv[i]);
		    return;
		  }
		break;

	      case 'a':
		asset_id_flag = true;
		TEST_EXTRA_ARG(i, 'a');
		{
		  ui32_t length;
		  Kumu::hex2bin(argv[i], asset_id_value, UUIDlen, &length);

		  if ( length != UUIDlen )
		    {
		      fprintf(stderr, "Unexpected asset ID length: %u, expecting %u characters.\n", length, UUIDlen);
		      return;
		    }
		}
		break;

	      case 'b':
		TEST_EXTRA_ARG(i, 'b');
		fb_size = Kumu::xabs(strtol(argv[i], 0, 10));

		if ( verbose_flag )
		  fprintf(stderr, "Frame Buffer size: %u bytes.\n", fb_size);

		break;

	      case 'C':
		TEST_EXTRA_ARG(i, 'C');
		if ( ! channel_assignment.DecodeHex(argv[i]) )
		  {
		    fprintf(stderr, "Error decoding UL value: %s\n", argv[i]);
		    return;
		  }
		break;

	      case 'd':
		TEST_EXTRA_ARG(i, 'd');
		duration = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 'E': encrypt_header_flag = false; break;
	      case 'e': encrypt_header_flag = true; break;

	      case 'f':
		TEST_EXTRA_ARG(i, 'f');
		start_frame = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 'g':
		TEST_EXTRA_ARG(i, 'g');
		mca_language = argv[i];
		break;

	      case 'h': help_flag = true; break;

	      case 'j': key_id_flag = true;
		TEST_EXTRA_ARG(i, 'j');
		{
		  ui32_t length;
		  Kumu::hex2bin(argv[i], key_id_value, UUIDlen, &length);

		  if ( length != UUIDlen )
		    {
		      fprintf(stderr, "Unexpected key ID length: %u, expecting %u characters.\n", length, UUIDlen);
		      return;
		    }
		}
		break;

	      case 'k': key_flag = true;
		TEST_EXTRA_ARG(i, 'k');
		{
		  ui32_t length;
		  Kumu::hex2bin(argv[i], key_value, KeyLen, &length);

		  if ( length != KeyLen )
		    {
		      fprintf(stderr, "Unexpected key length: %u, expecting %u characters.\n", length, KeyLen);
		      return;
		    }
		}
		break;

	      case 'l':
		TEST_EXTRA_ARG(i, 'l');
		channel_fmt = decode_channel_fmt(argv[i]);
		break;

	      case 'L': use_smpte_labels = true; break;
	      case 'M': write_hmac = false; break;

	      case 'm':
		TEST_EXTRA_ARG_ALLOW_DASH(i, 'm');
		mca_config_str = argv[i];
		break;

	      case 'P':
		TEST_EXTRA_ARG(i, 'P');
		if ( ! picture_coding.DecodeHex(argv[i]) )
		  {
		    fprintf(stderr, "Error decoding UL value: %s\n", argv[i]);
		    return;
		  }
		break;

	      case 'p':
		TEST_EXTRA_ARG(i, 'p');
		picture_rate = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 'Q': transfer_characteristic.Set(g_dict->ul(MDD_TransferCharacteristic_SMPTEST2084)); break;

	      case 's': dolby_atmos_sync_flag = true; break;

	      case 'T':
		TEST_EXTRA_ARG(i, 'T');
		if ( ! transfer_characteristic.DecodeHex(argv[i]) )
		  {
		    fprintf(stderr, "Error decoding UL value: %s\n", argv[i]);
		    return;
		  }
		break;

	      case 'u': show_ul_values_flag = true; break;
	      case 'V': version_flag = true; break;
	      case 'v': verbose_flag = true; break;
	      case 'w': use_interop_sound_wtf = true; break;
	      case 'W': no_write_flag = true; break;
	      case 'x': write_partial_pcm_flag = true; break;
	      case 'Z': j2c_pedantic = false; break;
	      case 'z': j2c_pedantic = true; break;

	      default:
		fprintf(stderr, "Unrecognized option: %s\n", argv[i]);
		return;
	      }
	  }
	else
	  {

	    if ( argv[i][0] != '-' )
	      {
		filenames.push_back(argv[i]);
	      }
	    else
	      {
		fprintf(stderr, "Unrecognized argument: %s\n", argv[i]);
		return;
	      }
	  }
      }

    if ( ! mca_config_str.empty() )
      {
	if ( mca_language.empty() )
	  {
	    if ( ! mca_config.DecodeString(mca_config_str) )
	      {
		return;
	      }
	  }
	else
	  {
	    if ( ! mca_config.DecodeString(mca_config_str, mca_language) )
	      {
		return;
	      }
	  }
      }
		
    if ( help_flag || version_flag )
      {
	return;
      }

    if ( filenames.size() < 2 )
      {
	fputs("Option requires at least two filename arguments: <input-file> <output-file>\n", stderr);
	return;
      }

    out_file = filenames.back();
    filenames.pop_back();
    error_flag = false;
  }